

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miditime.cpp
# Opt level: O3

void processMidiFile(MidiFile *midifile)

{
  int iVar1;
  int iVar2;
  byte *pbVar3;
  int iVar4;
  MidiEventList *this;
  MidiEvent *pMVar5;
  ostream *poVar6;
  pointer puVar7;
  byte bVar8;
  long lVar9;
  int index;
  double dVar10;
  
  smf::MidiFile::absoluteTicks(midifile);
  smf::MidiFile::joinTracks(midifile);
  index = 0;
  iVar4 = smf::MidiFile::getEventCount(midifile,0);
  if (0 < iVar4) {
    do {
      this = smf::MidiFile::operator[](midifile,0);
      pMVar5 = smf::MidiEventList::operator[](this,index);
      iVar1 = pMVar5->tick;
      iVar2 = pMVar5->track;
      dVar10 = smf::MidiFile::getTimeInSeconds(midifile,0,index);
      pbVar3 = (pMVar5->super_MidiMessage).
               super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      bVar8 = *pbVar3 & 0xf0;
      if (((onsetQ == 0) || (bVar8 == 0x90)) &&
         ((onsetQ == 0 || ((bVar8 != 0x90 || (pbVar3[2] != 0)))))) {
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\t",1);
        poVar6 = std::ostream::_M_insert<double>(dVar10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\t",1);
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\t",1);
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,index);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\t",1);
        puVar7 = (pMVar5->super_MidiMessage).
                 super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (0 < *(int *)&(pMVar5->super_MidiMessage).
                         super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish - (int)puVar7) {
          lVar9 = 0;
          do {
            if (lVar9 == 0) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"0x",2);
              *(uint *)(std::fstream::fstream + *(long *)(std::cout + -0x18)) =
                   *(uint *)(std::fstream::fstream + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
              poVar6 = (ostream *)
                       std::ostream::operator<<
                                 ((ostream *)&std::cout,
                                  (uint)*(pMVar5->super_MidiMessage).
                                         super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                                         .
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
              *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
                   *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
            }
            else {
              poVar6 = (ostream *)
                       std::ostream::operator<<((ostream *)&std::cout,(uint)puVar7[lVar9]);
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
            lVar9 = lVar9 + 1;
            puVar7 = (pMVar5->super_MidiMessage).
                     super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
          } while (lVar9 < *(int *)&(pMVar5->super_MidiMessage).
                                    super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (int)puVar7);
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
        std::ostream::put(-0x18);
        std::ostream::flush();
      }
      index = index + 1;
    } while (index != iVar4);
  }
  return;
}

Assistant:

void processMidiFile(MidiFile& midifile) {
   midifile.absoluteTicks();
   midifile.joinTracks();
   int eventcount = midifile.getEventCount(0);
   MidiEvent *ptr;
   for (int i=0; i<eventcount; i++) {
      ptr = &(midifile[0][i]);
      int track       = ptr->track;
      int timeinticks = ptr->tick;
      double timeinsecs  = midifile.getTimeInSeconds(0, i);
      int attack = ((*ptr)[0] & 0xf0) == 0x90;
      if (onsetQ && !attack) {
         continue;
      }
      if (onsetQ && attack) {
         if ((*ptr)[2] == 0) {
            continue;
         }
      }
      
      cout << timeinticks << "\t";
      cout << timeinsecs << "\t";
      cout << track << "\t";
      cout << i << "\t";
      for (int j=0; j<(int)ptr->size(); j++) {
         if (j == 0) {
            cout << "0x" << hex << (int)(*ptr)[j] << dec << " ";
         } else {
            cout << (int)(*ptr)[j] << " ";
         }
      }
      cout << endl;
   }
}